

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationDataBuilder::initForTailoring
          (CollationDataBuilder *this,CollationData *b,UErrorCode *errorCode)

{
  UBool UVar1;
  uint32_t value;
  UTrie2 *pUVar2;
  int local_24;
  uint32_t hangulCE32;
  UChar32 c;
  UErrorCode *errorCode_local;
  CollationData *b_local;
  CollationDataBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (this->trie == (UTrie2 *)0x0) {
      if (b == (CollationData *)0x0) {
        *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else {
        this->base = b;
        pUVar2 = utrie2_open_63(0xc0,0xfffd0505,errorCode);
        this->trie = pUVar2;
        for (local_24 = 0xc0; local_24 < 0x100; local_24 = local_24 + 1) {
          utrie2_set32_63(this->trie,local_24,0xc0,errorCode);
        }
        value = Collation::makeCE32FromTagAndIndex(0xc,0);
        utrie2_setRange32_63(this->trie,0xac00,0xd7a3,value,'\x01',errorCode);
        UnicodeSet::addAll(&this->unsafeBackwardSet,b->unsafeBackwardSet);
        ::U_FAILURE(*errorCode);
      }
    }
    else {
      *errorCode = U_INVALID_STATE_ERROR;
    }
  }
  return;
}

Assistant:

void
CollationDataBuilder::initForTailoring(const CollationData *b, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    if(trie != NULL) {
        errorCode = U_INVALID_STATE_ERROR;
        return;
    }
    if(b == NULL) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    base = b;

    // For a tailoring, the default is to fall back to the base.
    trie = utrie2_open(Collation::FALLBACK_CE32, Collation::FFFD_CE32, &errorCode);

    // Set the Latin-1 letters block so that it is allocated first in the data array,
    // to try to improve locality of reference when sorting Latin-1 text.
    // Do not use utrie2_setRange32() since that will not actually allocate blocks
    // that are filled with the default value.
    // ASCII (0..7F) is already preallocated anyway.
    for(UChar32 c = 0xc0; c <= 0xff; ++c) {
        utrie2_set32(trie, c, Collation::FALLBACK_CE32, &errorCode);
    }

    // Hangul syllables are not tailorable (except via tailoring Jamos).
    // Always set the Hangul tag to help performance.
    // Do this here, rather than in buildMappings(),
    // so that we see the HANGUL_TAG in various assertions.
    uint32_t hangulCE32 = Collation::makeCE32FromTagAndIndex(Collation::HANGUL_TAG, 0);
    utrie2_setRange32(trie, Hangul::HANGUL_BASE, Hangul::HANGUL_END, hangulCE32, TRUE, &errorCode);

    // Copy the set contents but don't copy/clone the set as a whole because
    // that would copy the isFrozen state too.
    unsafeBackwardSet.addAll(*b->unsafeBackwardSet);

    if(U_FAILURE(errorCode)) { return; }
}